

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reaction.cpp
# Opt level: O3

void __thiscall
BindPolymerase::BindPolymerase
          (BindPolymerase *this,double rate_constant,double volume,string *promoter_name,
          Polymerase *pol_template)

{
  pointer pcVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  undefined4 uVar5;
  undefined4 uVar6;
  undefined4 uVar7;
  int iVar8;
  
  Bind::Bind(&this->super_Bind,rate_constant,volume,promoter_name);
  (this->super_Bind).super_Reaction._vptr_Reaction = (_func_int **)&PTR_CalculatePropensity_001a5bd8
  ;
  (this->pol_template_).super_MobileElement.super_enable_shared_from_this<MobileElement>.
  _M_weak_this.super___weak_ptr<MobileElement,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  (this->pol_template_).super_MobileElement.super_enable_shared_from_this<MobileElement>.
  _M_weak_this.super___weak_ptr<MobileElement,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  (this->pol_template_).super_MobileElement._vptr_MobileElement =
       (_func_int **)&PTR___cxa_pure_virtual_001a55f0;
  (this->pol_template_).super_MobileElement.name_._M_dataplus._M_p =
       (pointer)&(this->pol_template_).super_MobileElement.name_.field_2;
  pcVar1 = (pol_template->super_MobileElement).name_._M_dataplus._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&(this->pol_template_).super_MobileElement.name_,pcVar1,
             pcVar1 + (pol_template->super_MobileElement).name_._M_string_length);
  iVar2 = (pol_template->super_MobileElement).start_;
  iVar3 = (pol_template->super_MobileElement).stop_;
  iVar4 = (pol_template->super_MobileElement).footprint_;
  uVar5 = *(undefined4 *)&(pol_template->super_MobileElement).field_0x44;
  uVar6 = *(undefined4 *)&(pol_template->super_MobileElement).speed_;
  uVar7 = *(undefined4 *)((long)&(pol_template->super_MobileElement).speed_ + 4);
  iVar8 = (pol_template->super_MobileElement).reading_frame_;
  *(undefined4 *)&(this->pol_template_).super_MobileElement.field_0x44 =
       *(undefined4 *)&(pol_template->super_MobileElement).field_0x44;
  *(undefined4 *)&(this->pol_template_).super_MobileElement.speed_ = uVar6;
  *(undefined4 *)((long)&(this->pol_template_).super_MobileElement.speed_ + 4) = uVar7;
  (this->pol_template_).super_MobileElement.reading_frame_ = iVar8;
  (this->pol_template_).super_MobileElement.start_ = iVar2;
  (this->pol_template_).super_MobileElement.stop_ = iVar3;
  (this->pol_template_).super_MobileElement.footprint_ = iVar4;
  *(undefined4 *)&(this->pol_template_).super_MobileElement.field_0x44 = uVar5;
  (this->pol_template_).super_MobileElement.gene_bound_._M_dataplus._M_p =
       (pointer)&(this->pol_template_).super_MobileElement.gene_bound_.field_2;
  pcVar1 = (pol_template->super_MobileElement).gene_bound_._M_dataplus._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&(this->pol_template_).super_MobileElement.gene_bound_,pcVar1,
             pcVar1 + (pol_template->super_MobileElement).gene_bound_._M_string_length);
  (this->pol_template_).super_MobileElement.polymerasereadthrough_ =
       (pol_template->super_MobileElement).polymerasereadthrough_;
  (this->pol_template_).super_MobileElement._vptr_MobileElement =
       (_func_int **)&PTR__MobileElement_001a5620;
  (this->super_Bind).rate_constant_ = (this->super_Bind).rate_constant_ / (volume * 6.0221409e+23);
  return;
}

Assistant:

BindPolymerase::BindPolymerase(double rate_constant, double volume,
                               const std::string &promoter_name,
                               const Polymerase &pol_template)
    : Bind(rate_constant, volume, promoter_name), pol_template_(pol_template) {
  rate_constant_ = rate_constant_ / (AVAGADRO * volume);
}